

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O2

int __thiscall cmCTestScriptHandler::BackupDirectories(cmCTestScriptHandler *this)

{
  string *filename;
  string *filename_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  string local_b0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  local_60.View_._M_str = (this->SourceDir)._M_dataplus._M_p;
  local_60.View_._M_len = (this->SourceDir)._M_string_length;
  local_90.View_._M_len = 0xc;
  local_90.View_._M_str = "_CMakeBackup";
  cmStrCat<>(&local_b0,&local_60,&local_90);
  filename = &this->BackupSourceDir;
  std::__cxx11::string::operator=((string *)filename,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  local_60.View_._M_str = (this->BinaryDir)._M_dataplus._M_p;
  local_60.View_._M_len = (this->BinaryDir)._M_string_length;
  local_90.View_._M_len = 0xc;
  local_90.View_._M_str = "_CMakeBackup";
  cmStrCat<>(&local_b0,&local_60,&local_90);
  filename_00 = &this->BackupBinaryDir;
  std::__cxx11::string::operator=((string *)filename_00,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  iVar3 = 0;
  if (this->Backup == true) {
    bVar1 = cmsys::SystemTools::FileExists(filename);
    if (bVar1) {
      cmsys::SystemTools::RemoveADirectory(filename);
    }
    bVar1 = cmsys::SystemTools::FileExists(filename_00);
    if (bVar1) {
      cmsys::SystemTools::RemoveADirectory(filename_00);
    }
    rename((this->SourceDir)._M_dataplus._M_p,(this->BackupSourceDir)._M_dataplus._M_p);
    rename((this->BinaryDir)._M_dataplus._M_p,(this->BackupBinaryDir)._M_dataplus._M_p);
    iVar2 = CheckOutSourceDir(this);
    iVar3 = 0;
    if (iVar2 != 0) {
      RestoreBackupDirectories(this);
      iVar3 = iVar2;
    }
  }
  return iVar3;
}

Assistant:

int cmCTestScriptHandler::BackupDirectories()
{
  int retVal;

  // compute the backup names
  this->BackupSourceDir = cmStrCat(this->SourceDir, "_CMakeBackup");
  this->BackupBinaryDir = cmStrCat(this->BinaryDir, "_CMakeBackup");

  // backup the binary and src directories if requested
  if (this->Backup) {
    // if for some reason those directories exist then first delete them
    if (cmSystemTools::FileExists(this->BackupSourceDir)) {
      cmSystemTools::RemoveADirectory(this->BackupSourceDir);
    }
    if (cmSystemTools::FileExists(this->BackupBinaryDir)) {
      cmSystemTools::RemoveADirectory(this->BackupBinaryDir);
    }

    // first rename the src and binary directories
    rename(this->SourceDir.c_str(), this->BackupSourceDir.c_str());
    rename(this->BinaryDir.c_str(), this->BackupBinaryDir.c_str());

    // we must now checkout the src dir
    retVal = this->CheckOutSourceDir();
    if (retVal) {
      this->RestoreBackupDirectories();
      return retVal;
    }
  }

  return 0;
}